

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O1

aom_codec_err_t
aom_codec_enc_config_default(aom_codec_iface_t *iface,aom_codec_enc_cfg_t *cfg,uint usage)

{
  aom_codec_enc_cfg_t *paVar1;
  long lVar2;
  long lVar3;
  
  if (cfg != (aom_codec_enc_cfg_t *)0x0 && iface != (aom_codec_iface_t *)0x0) {
    if ((iface->caps & 2) == 0) {
      return AOM_CODEC_INCAPABLE;
    }
    lVar2 = (long)(iface->enc).cfg_count;
    if (0 < lVar2) {
      paVar1 = (iface->enc).cfgs;
      lVar3 = 0;
      do {
        if (*(uint *)((long)&paVar1->g_usage + lVar3) == usage) {
          memcpy(cfg,(void *)((long)&paVar1->g_usage + lVar3),0x388);
          memset(&cfg->encoder_cfg,0,0x8c);
          (cfg->encoder_cfg).max_partition_size = 0x80;
          (cfg->encoder_cfg).min_partition_size = 4;
          (cfg->encoder_cfg).disable_trellis_quant = 3;
          return AOM_CODEC_OK;
        }
        lVar3 = lVar3 + 0x388;
      } while (lVar2 * 0x388 - lVar3 != 0);
    }
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_codec_enc_config_default(aom_codec_iface_t *iface,
                                             aom_codec_enc_cfg_t *cfg,
                                             unsigned int usage) {
  aom_codec_err_t res;

  if (!iface || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!(iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else {
    res = AOM_CODEC_INVALID_PARAM;

    for (int i = 0; i < iface->enc.cfg_count; ++i) {
      if (iface->enc.cfgs[i].g_usage == usage) {
        *cfg = iface->enc.cfgs[i];
        res = AOM_CODEC_OK;
        /* default values */
        memset(&cfg->encoder_cfg, 0, sizeof(cfg->encoder_cfg));
        cfg->encoder_cfg.super_block_size = 0;  // Dynamic
        cfg->encoder_cfg.max_partition_size = 128;
        cfg->encoder_cfg.min_partition_size = 4;
        cfg->encoder_cfg.disable_trellis_quant = 3;
        break;
      }
    }
  }
  return res;
}